

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

char * columnTypeImpl(NameContext *pNC,Expr *pExpr)

{
  short sVar1;
  SrcList *pSVar2;
  char *pcVar3;
  uint uVar4;
  long lVar5;
  Expr *pExpr_00;
  ulong uVar6;
  long lVar7;
  NameContext sNC;
  NameContext local_38;
  
  if (pExpr->op == 0x8a) {
    local_38.pSrcList = ((pExpr->x).pSelect)->pSrc;
    pExpr_00 = ((pExpr->x).pSelect)->pEList->a[0].pExpr;
LAB_0019f2ae:
    local_38.pParse = pNC->pParse;
    local_38.pNext = pNC;
    pcVar3 = columnTypeImpl(&local_38,pExpr_00);
  }
  else {
    if (pExpr->op == 0xa7) {
      sVar1 = pExpr->iColumn;
      uVar4 = (uint)sVar1;
      lVar5 = 0;
LAB_0019f218:
      for (lVar7 = 0; (pNC != (NameContext *)0x0 && (lVar7 == 0));
          lVar7 = *(long *)((long)&pSVar2->a[0].pTab + lVar7)) {
        pSVar2 = pNC->pSrcList;
        uVar6 = (ulong)(uint)pSVar2->nSrc;
        if (pSVar2->nSrc < 1) {
          uVar6 = 0;
        }
        lVar7 = 0;
        while( true ) {
          if (uVar6 * 0x68 - lVar7 == 0) {
            pNC = pNC->pNext;
            goto LAB_0019f218;
          }
          if (*(int *)((long)&pSVar2->a[0].iCursor + lVar7) == pExpr->iTable) break;
          lVar7 = lVar7 + 0x68;
        }
        lVar5 = *(long *)((long)&pSVar2->a[0].pSelect + lVar7);
      }
      if (lVar7 != 0) {
        if (lVar5 == 0) {
          if (sVar1 < 0) {
            return "INTEGER";
          }
          pcVar3 = sqlite3ColumnType((Column *)((ulong)uVar4 * 0x10 + *(long *)(lVar7 + 8)),
                                     (char *)0x0);
          return pcVar3;
        }
        if (sVar1 < 0) {
          return (char *)0x0;
        }
        if (**(int **)(lVar5 + 0x20) <= (int)uVar4) {
          return (char *)0x0;
        }
        pExpr_00 = *(Expr **)(*(int **)(lVar5 + 0x20) + (ulong)uVar4 * 6 + 2);
        local_38.pSrcList = *(SrcList **)(lVar5 + 0x28);
        goto LAB_0019f2ae;
      }
    }
    pcVar3 = (char *)0x0;
  }
  return pcVar3;
}

Assistant:

static const char *columnTypeImpl(
  NameContext *pNC,
#ifndef SQLITE_ENABLE_COLUMN_METADATA
  Expr *pExpr
#else
  Expr *pExpr,
  const char **pzOrigDb,
  const char **pzOrigTab,
  const char **pzOrigCol
#endif
){
  char const *zType = 0;
  int j;
#ifdef SQLITE_ENABLE_COLUMN_METADATA
  char const *zOrigDb = 0;
  char const *zOrigTab = 0;
  char const *zOrigCol = 0;
#endif

  assert( pExpr!=0 );
  assert( pNC->pSrcList!=0 );
  switch( pExpr->op ){
    case TK_COLUMN: {
      /* The expression is a column. Locate the table the column is being
      ** extracted from in NameContext.pSrcList. This table may be real
      ** database table or a subquery.
      */
      Table *pTab = 0;            /* Table structure column is extracted from */
      Select *pS = 0;             /* Select the column is extracted from */
      int iCol = pExpr->iColumn;  /* Index of column in pTab */
      while( pNC && !pTab ){
        SrcList *pTabList = pNC->pSrcList;
        for(j=0;j<pTabList->nSrc && pTabList->a[j].iCursor!=pExpr->iTable;j++);
        if( j<pTabList->nSrc ){
          pTab = pTabList->a[j].pTab;
          pS = pTabList->a[j].pSelect;
        }else{
          pNC = pNC->pNext;
        }
      }

      if( pTab==0 ){
        /* At one time, code such as "SELECT new.x" within a trigger would
        ** cause this condition to run.  Since then, we have restructured how
        ** trigger code is generated and so this condition is no longer
        ** possible. However, it can still be true for statements like
        ** the following:
        **
        **   CREATE TABLE t1(col INTEGER);
        **   SELECT (SELECT t1.col) FROM FROM t1;
        **
        ** when columnType() is called on the expression "t1.col" in the
        ** sub-select. In this case, set the column type to NULL, even
        ** though it should really be "INTEGER".
        **
        ** This is not a problem, as the column type of "t1.col" is never
        ** used. When columnType() is called on the expression
        ** "(SELECT t1.col)", the correct type is returned (see the TK_SELECT
        ** branch below.  */
        break;
      }

      assert( pTab && ExprUseYTab(pExpr) && pExpr->y.pTab==pTab );
      if( pS ){
        /* The "table" is actually a sub-select or a view in the FROM clause
        ** of the SELECT statement. Return the declaration type and origin
        ** data for the result-set column of the sub-select.
        */
        if( iCol<pS->pEList->nExpr
#ifdef SQLITE_ALLOW_ROWID_IN_VIEW
         && iCol>=0
#else
         && ALWAYS(iCol>=0)
#endif
        ){
          /* If iCol is less than zero, then the expression requests the
          ** rowid of the sub-select or view. This expression is legal (see
          ** test case misc2.2.2) - it always evaluates to NULL.
          */
          NameContext sNC;
          Expr *p = pS->pEList->a[iCol].pExpr;
          sNC.pSrcList = pS->pSrc;
          sNC.pNext = pNC;
          sNC.pParse = pNC->pParse;
          zType = columnType(&sNC, p,&zOrigDb,&zOrigTab,&zOrigCol);
        }
      }else{
        /* A real table or a CTE table */
        assert( !pS );
#ifdef SQLITE_ENABLE_COLUMN_METADATA
        if( iCol<0 ) iCol = pTab->iPKey;
        assert( iCol==XN_ROWID || (iCol>=0 && iCol<pTab->nCol) );
        if( iCol<0 ){
          zType = "INTEGER";
          zOrigCol = "rowid";
        }else{
          zOrigCol = pTab->aCol[iCol].zCnName;
          zType = sqlite3ColumnType(&pTab->aCol[iCol],0);
        }
        zOrigTab = pTab->zName;
        if( pNC->pParse && pTab->pSchema ){
          int iDb = sqlite3SchemaToIndex(pNC->pParse->db, pTab->pSchema);
          zOrigDb = pNC->pParse->db->aDb[iDb].zDbSName;
        }
#else
        assert( iCol==XN_ROWID || (iCol>=0 && iCol<pTab->nCol) );
        if( iCol<0 ){
          zType = "INTEGER";
        }else{
          zType = sqlite3ColumnType(&pTab->aCol[iCol],0);
        }
#endif
      }
      break;
    }
#ifndef SQLITE_OMIT_SUBQUERY
    case TK_SELECT: {
      /* The expression is a sub-select. Return the declaration type and
      ** origin info for the single column in the result set of the SELECT
      ** statement.
      */
      NameContext sNC;
      Select *pS;
      Expr *p;
      assert( ExprUseXSelect(pExpr) );
      pS = pExpr->x.pSelect;
      p = pS->pEList->a[0].pExpr;
      sNC.pSrcList = pS->pSrc;
      sNC.pNext = pNC;
      sNC.pParse = pNC->pParse;
      zType = columnType(&sNC, p, &zOrigDb, &zOrigTab, &zOrigCol);
      break;
    }
#endif
  }

#ifdef SQLITE_ENABLE_COLUMN_METADATA
  if( pzOrigDb ){
    assert( pzOrigTab && pzOrigCol );
    *pzOrigDb = zOrigDb;
    *pzOrigTab = zOrigTab;
    *pzOrigCol = zOrigCol;
  }
#endif
  return zType;
}